

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
          (SquareMatrix<std::complex<float>_> *this,complex<float> m00,complex<float> m01,
          complex<float> m10,complex<float> m11)

{
  type pcVar1;
  _ComplexT in_XMM0_Qa;
  _ComplexT in_XMM1_Qa;
  _ComplexT in_XMM2_Qa;
  _ComplexT in_XMM3_Qa;
  SquareMatrix<std::complex<float>_> *this_local;
  complex<float> m11_local;
  complex<float> m10_local;
  complex<float> m01_local;
  complex<float> m00_local;
  
  this->size_ = 2;
  alloc_unique_array<std::complex<float>>((dense *)&this->data_,4);
  pcVar1 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&this->data_,0);
  pcVar1->_M_value = in_XMM0_Qa;
  pcVar1 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&this->data_,1);
  pcVar1->_M_value = in_XMM2_Qa;
  pcVar1 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&this->data_,2);
  pcVar1->_M_value = in_XMM1_Qa;
  pcVar1 = std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
           operator[](&this->data_,3);
  pcVar1->_M_value = in_XMM3_Qa;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 ,
                      const T m10 , const T m11 )
        : size_( 2 )
        , data_( alloc_unique_array< T >( 4 ) )
        {
          data_[0] = m00 ; data_[1] = m10 ;
          data_[2] = m01 ; data_[3] = m11 ;
        }